

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O0

duckdb_state duckdb_append_internal<int>(duckdb_appender appender,int value)

{
  pointer this;
  long in_RDI;
  ErrorData error;
  exception *ex;
  AppenderWrapper *appender_instance;
  int32_t in_stack_ffffffffffffff3c;
  unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>
  *in_stack_ffffffffffffff40;
  undefined4 local_4;
  
  if (in_RDI != 0) {
    this = duckdb::unique_ptr<duckdb::Appender,_std::default_delete<duckdb::Appender>,_true>::
           operator->(in_stack_ffffffffffffff40);
    duckdb::BaseAppender::Append<int>(&this->super_BaseAppender,in_stack_ffffffffffffff3c);
  }
  local_4 = (duckdb_state)(in_RDI == 0);
  return local_4;
}

Assistant:

duckdb_state duckdb_append_internal(duckdb_appender appender, T value) {
	if (!appender) {
		return DuckDBError;
	}
	auto *appender_instance = reinterpret_cast<AppenderWrapper *>(appender);
	try {
		appender_instance->appender->Append<T>(value);
	} catch (std::exception &ex) {
		ErrorData error(ex);
		appender_instance->error = error.RawMessage();
		return DuckDBError;
	} catch (...) {
		return DuckDBError;
	}
	return DuckDBSuccess;
}